

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>>
::
call_impl<anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>,anurbs::Ref<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>(*&)(anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>),0ul,1ul,2ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,unsigned_long,std::shared_ptr<anurbs::Surface<2l,anurbs::Ref<anurbs::NurbsSurfaceGeometry<2l>>>>>
           *this,long f,undefined8 *param_3)

{
  code *pcVar1;
  undefined8 uVar2;
  itype *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_> RVar5;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pcVar1 = (code *)*param_3;
  piVar3 = type_caster_base::operator_cast_to_Model_((type_caster_base *)(f + 0x30));
  local_28 = *(undefined8 *)(f + 0x18);
  uVar2 = *(undefined8 *)(f + 0x28);
  local_20 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(f + 0x20);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (*pcVar1)(this,piVar3,uVar2,&local_28);
  _Var4._M_pi = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var4._M_pi = extraout_RDX_00;
  }
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var4._M_pi;
  RVar5.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>)
         RVar5.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }